

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Utf8CharLen(char *zIn,int nByte)

{
  byte bVar1;
  u8 *puVar2;
  u8 *zTerm;
  u8 *z;
  int r;
  int nByte_local;
  char *zIn_local;
  
  r = 0;
  z = (u8 *)zIn;
  if (nByte < 0) {
    zTerm = (u8 *)0xffffffffffffffff;
  }
  else {
    zTerm = (u8 *)(zIn + nByte);
  }
  while (*z != '\0' && z < zTerm) {
    puVar2 = z + 1;
    bVar1 = *z;
    z = puVar2;
    if (0xbf < bVar1) {
      for (; (*z & 0xc0) == 0x80; z = z + 1) {
      }
    }
    r = r + 1;
  }
  return r;
}

Assistant:

SQLITE_PRIVATE int sqlite3Utf8CharLen(const char *zIn, int nByte){
  int r = 0;
  const u8 *z = (const u8*)zIn;
  const u8 *zTerm;
  if( nByte>=0 ){
    zTerm = &z[nByte];
  }else{
    zTerm = (const u8*)(-1);
  }
  assert( z<=zTerm );
  while( *z!=0 && z<zTerm ){
    SQLITE_SKIP_UTF8(z);
    r++;
  }
  return r;
}